

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void tqli(double *d,int N,double *e,double *z)

{
  int iVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double local_a0;
  double b;
  double c;
  double dd;
  double f;
  double g;
  double p;
  double r;
  double s;
  int local_38;
  int k;
  int i;
  int iter;
  int l;
  int m;
  double *z_local;
  double *e_local;
  int N_local;
  double *d_local;
  
  for (local_38 = 1; local_38 < N; local_38 = local_38 + 1) {
    e[local_38 + -1] = e[local_38];
  }
  e[N + -1] = 0.0;
  i = 0;
  do {
    if (N <= i) {
      return;
    }
    k = 0;
    do {
      for (iter = i; iter < N + -1; iter = iter + 1) {
        dVar3 = ABS(d[iter]) + ABS(d[iter + 1]);
        if ((ABS(e[iter]) + dVar3 == dVar3) && (!NAN(ABS(e[iter]) + dVar3) && !NAN(dVar3))) break;
      }
      if (iter != i) {
        iVar2 = k + 1;
        if (k == 0x1e) {
          printf("Too many iterations in tqli");
        }
        dVar3 = (d[i + 1] - d[i]) / (e[i] * 2.0);
        p = pythag(dVar3,1.0);
        if (dVar3 < 0.0) {
          local_a0 = -ABS(p);
        }
        else {
          local_a0 = ABS(p);
        }
        f = (d[iter] - d[i]) + e[i] / (dVar3 + local_a0);
        b = 1.0;
        r = 1.0;
        g = 0.0;
        iVar1 = iter;
        while (local_38 = iVar1 + -1, i <= local_38) {
          dVar3 = e[local_38];
          dVar4 = b * e[local_38];
          p = pythag(r * dVar3,f);
          e[iVar1] = p;
          if ((p == 0.0) && (!NAN(p))) {
            d[iVar1] = d[iVar1] - g;
            e[iter] = 0.0;
            break;
          }
          r = (r * dVar3) / p;
          b = f / p;
          dVar3 = d[iVar1] - g;
          p = (d[local_38] - dVar3) * r + b * 2.0 * dVar4;
          g = r * p;
          d[iVar1] = dVar3 + g;
          f = b * p + -dVar4;
          for (s._4_4_ = 0; iVar1 = local_38, s._4_4_ < N; s._4_4_ = s._4_4_ + 1) {
            dVar3 = z[s._4_4_ * N + local_38 + 1];
            z[s._4_4_ * N + local_38 + 1] = r * z[s._4_4_ * N + local_38] + b * dVar3;
            z[s._4_4_ * N + local_38] = b * z[s._4_4_ * N + local_38] + -(r * dVar3);
          }
        }
        k = iVar2;
        if (((p != 0.0) || (NAN(p))) || (local_38 < i)) {
          d[i] = d[i] - g;
          e[i] = f;
          e[iter] = 0.0;
        }
      }
    } while (iter != i);
    i = i + 1;
  } while( true );
}

Assistant:

static void tqli(double *d, int N, double *e, double *z) {
	int m, l, iter, i, k;
	double s, r, p, g, f, dd, c, b;

	for (i = 1; i < N; ++i) {
		e[i - 1] = e[i];
	}
	e[N - 1] = 0;

	for (l = 0; l < N; ++l) {
		iter = 0;
		do {
			for (m = l; m < N - 1; ++m) {
				dd =(double) fabs(d[m]) + fabs(d[m + 1]);
				if ((double)(fabs(e[m]) + dd) == dd) {
					break;
				}
			}
			if (m != l) {
				if (iter++ == 30) {
					printf("Too many iterations in tqli");
				}
				g = (d[l + 1] - d[l]) / (2.0*e[l]);
				r = pythag(g, 1.0);
				g = d[m] - d[l] + e[l] / (g + (double) SIGN(r, g)); 
				s = c = 1.0;
				p = 0.0;
				for (i = m - 1; i >= l; --i) {
					f = s*e[i];
					b = c*e[i];
					e[i + 1] = (r = pythag(f, g));
					if (r == 0.0) {
						d[i + 1] -= p;
						e[m] = 0.0;
						break;
					}
					s = f / r;
					c = g / r;
					g = d[i + 1] - p;
					r = (d[i] - g)*s + 2.0*c*b;
					d[i + 1] = g + (p = s*r);
					g = c*r - b;
					for (k = 0; k < N; ++k) {
						f = z[k*N + i + 1];
						z[k*N + i + 1] = s*z[k*N + i] + c*f;
						z[k*N + i] = c*z[k*N + i] - s*f;
					}
				}
				if (r == 0.0 && i >= l) continue;
				d[l] -= p;
				e[l] = g;
				e[m] = 0.0;
			}
		} while (m != l);
	}
}